

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall ft::list<int,_ft::allocator<int>_>::pop_front(list<int,_ft::allocator<int>_> *this)

{
  node *pnVar1;
  listNode<int> *plVar2;
  listNode<int> *plVar3;
  
  pnVar1 = this->m_head;
  plVar2 = pnVar1->next;
  plVar3 = plVar2->next;
  pnVar1->next = plVar3;
  plVar3->prev = pnVar1;
  operator_delete(plVar2);
  this->m_size = this->m_size - 1;
  return;
}

Assistant:

void pop_front() {
		node*	delNode = this->head()->next;
		this->head()->next = delNode->next;
		this->head()->next->prev = this->head();
		this->m_alloc.destroy(delNode);
		this->m_alloc.deallocate(delNode, 1);
		--this->m_size;
	}